

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int x509_get_current_time(mbedtls_x509_time *now)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  int iVar7;
  mbedtls_time_t tt;
  
  iVar7 = 0;
  tt = time((time_t *)0x0);
  ptVar6 = gmtime(&tt);
  if (ptVar6 == (tm *)0x0) {
    iVar7 = -1;
  }
  else {
    uVar1 = ptVar6->tm_mon;
    uVar2 = ptVar6->tm_year;
    now->year = uVar2 + 0x76c;
    now->mon = uVar1 + 1;
    iVar3 = ptVar6->tm_sec;
    iVar4 = ptVar6->tm_min;
    iVar5 = ptVar6->tm_hour;
    now->day = ptVar6->tm_mday;
    now->hour = iVar5;
    now->min = iVar4;
    now->sec = iVar3;
  }
  return iVar7;
}

Assistant:

static int x509_get_current_time( mbedtls_x509_time *now )
{
    struct tm *lt;
    mbedtls_time_t tt;
    int ret = 0;

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_lock( &mbedtls_threading_gmtime_mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    tt = mbedtls_time( NULL );
    lt = gmtime( &tt );

    if( lt == NULL )
        ret = -1;
    else
    {
        now->year = lt->tm_year + 1900;
        now->mon  = lt->tm_mon  + 1;
        now->day  = lt->tm_mday;
        now->hour = lt->tm_hour;
        now->min  = lt->tm_min;
        now->sec  = lt->tm_sec;
    }

#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &mbedtls_threading_gmtime_mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}